

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O1

void __thiscall Rml::ElementScroll::ElementScroll(ElementScroll *this,Element *_element)

{
  long lVar1;
  Scrollbar *this_00;
  
  this_00 = this->scrollbars;
  lVar1 = 0;
  do {
    Scrollbar::Scrollbar(this_00);
    lVar1 = lVar1 + -0x18;
    this_00 = this_00 + 1;
  } while (lVar1 != -0x30);
  this->element = _element;
  this->corner = (Element *)0x0;
  return;
}

Assistant:

ElementScroll::ElementScroll(Element* _element)
{
	element = _element;
	corner = nullptr;
}